

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O2

void __thiscall re2c::dfa_t::~dfa_t(dfa_t *this)

{
  pointer ppdVar1;
  dfa_state_t *this_00;
  pointer ppdVar2;
  
  ppdVar1 = (this->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppdVar2 = (this->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppdVar2 != ppdVar1; ppdVar2 = ppdVar2 + 1
      ) {
    this_00 = *ppdVar2;
    if (this_00 != (dfa_state_t *)0x0) {
      dfa_state_t::~dfa_state_t(this_00);
    }
    operator_delete(this_00,0x18);
  }
  std::_Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::~_Vector_base
            ((_Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_> *)this);
  return;
}

Assistant:

dfa_t::~dfa_t()
{
	std::vector<dfa_state_t*>::iterator
		i = states.begin(),
		e = states.end();
	for (; i != e; ++i)
	{
		delete *i;
	}
}